

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ScratchMalloc(int n)

{
  ScratchFreeslot *local_18;
  void *p;
  int n_local;
  
  p._4_4_ = n;
  sqlite3_mutex_enter(mem0.mutex);
  if ((mem0.nScratchFree == 0) || (sqlite3Config.szScratch < p._4_4_)) {
    if (sqlite3Config.bMemstat == 0) {
      sqlite3_mutex_leave(mem0.mutex);
      local_18 = (ScratchFreeslot *)(*sqlite3Config.m.xMalloc)(p._4_4_);
    }
    else {
      sqlite3StatusSet(8,p._4_4_);
      p._4_4_ = mallocWithAlarm(p._4_4_,&local_18);
      if (local_18 != (ScratchFreeslot *)0x0) {
        sqlite3StatusAdd(4,p._4_4_);
      }
      sqlite3_mutex_leave(mem0.mutex);
    }
  }
  else {
    local_18 = mem0.pScratchFree;
    mem0.pScratchFree = (mem0.pScratchFree)->pNext;
    mem0.nScratchFree = mem0.nScratchFree - 1;
    sqlite3StatusAdd(3,1);
    sqlite3StatusSet(8,p._4_4_);
    sqlite3_mutex_leave(mem0.mutex);
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ScratchMalloc(int n){
  void *p;
  assert( n>0 );

  sqlite3_mutex_enter(mem0.mutex);
  if( mem0.nScratchFree && sqlite3GlobalConfig.szScratch>=n ){
    p = mem0.pScratchFree;
    mem0.pScratchFree = mem0.pScratchFree->pNext;
    mem0.nScratchFree--;
    sqlite3StatusAdd(SQLITE_STATUS_SCRATCH_USED, 1);
    sqlite3StatusSet(SQLITE_STATUS_SCRATCH_SIZE, n);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    if( sqlite3GlobalConfig.bMemstat ){
      sqlite3StatusSet(SQLITE_STATUS_SCRATCH_SIZE, n);
      n = mallocWithAlarm(n, &p);
      if( p ) sqlite3StatusAdd(SQLITE_STATUS_SCRATCH_OVERFLOW, n);
      sqlite3_mutex_leave(mem0.mutex);
    }else{
      sqlite3_mutex_leave(mem0.mutex);
      p = sqlite3GlobalConfig.m.xMalloc(n);
    }
    sqlite3MemdebugSetType(p, MEMTYPE_SCRATCH);
  }
  assert( sqlite3_mutex_notheld(mem0.mutex) );


#if SQLITE_THREADSAFE==0 && !defined(NDEBUG)
  /* Verify that no more than two scratch allocations per thread
  ** are outstanding at one time.  (This is only checked in the
  ** single-threaded case since checking in the multi-threaded case
  ** would be much more complicated.) */
  assert( scratchAllocOut<=1 );
  if( p ) scratchAllocOut++;
#endif

  return p;
}